

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
::int_writer<unsigned_int,fmt::v5::basic_format_specs<wchar_t>>::num_writer::operator()
          (num_writer *this,
          back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *it)

{
  wchar_t *pwVar1;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> bVar2;
  uint uVar3;
  wchar_t wVar4;
  long lVar5;
  wchar_t *__last;
  int iVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  char_type buffer [13];
  wchar_t local_68 [14];
  
  bVar2 = (back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>)it->container;
  uVar10 = *(uint *)this;
  __last = local_68 + *(int *)(this + 4);
  pwVar1 = __last;
  if (uVar10 < 100) {
    bVar12 = false;
  }
  else {
    iVar6 = -1;
    uVar7 = 1;
    iVar8 = -2;
    uVar9 = 2;
    do {
      uVar3 = uVar10;
      uVar11 = (ulong)((uVar3 % 100) * 2);
      pwVar1[-1] = (int)(char)internal::basic_data<void>::DIGITS[uVar11 + 1];
      lVar5 = -4;
      if ((uVar7 / 3) * 3 + iVar6 == 0) {
        pwVar1[-2] = *(wchar_t *)(this + 8);
        lVar5 = -8;
      }
      *(int *)((long)pwVar1 + lVar5 + -4) = (int)(char)internal::basic_data<void>::DIGITS[uVar11];
      if ((int)(uVar9 / 3) * 3 + iVar8 == 0) {
        *(undefined4 *)((long)pwVar1 + lVar5 + -8) = *(undefined4 *)(this + 8);
        lVar5 = lVar5 + -8;
      }
      else {
        lVar5 = lVar5 + -4;
      }
      pwVar1 = (wchar_t *)((long)pwVar1 + lVar5);
      iVar6 = iVar6 + -2;
      uVar7 = uVar7 + 2;
      iVar8 = iVar8 + -2;
      uVar9 = (ulong)((int)uVar9 + 2);
      uVar10 = uVar3 / 100;
    } while (9999 < uVar3);
    bVar12 = iVar6 + (uVar7 / 3) * 3 == 0;
    uVar10 = uVar3 / 100;
  }
  if (uVar10 < 10) {
    wVar4 = uVar10 | 0x30;
  }
  else {
    pwVar1[-1] = (int)(char)internal::basic_data<void>::DIGITS[((ulong)uVar10 * 2 & 0xffffffff) + 1]
    ;
    lVar5 = -4;
    if (bVar12) {
      pwVar1[-2] = *(wchar_t *)(this + 8);
      lVar5 = -8;
    }
    pwVar1 = (wchar_t *)((long)pwVar1 + lVar5);
    wVar4 = (wchar_t)(char)internal::basic_data<void>::DIGITS[(ulong)uVar10 * 2];
  }
  pwVar1[-1] = wVar4;
  bVar2 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<wchar_t*,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>>
                    (local_68,__last,bVar2);
  it->container = (vector<wchar_t,_std::allocator<wchar_t>_> *)bVar2;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }